

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall
smf::MidiMessage::makeSysExMessage
          (MidiMessage *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer puVar1;
  int iVar2;
  const_reference __x;
  int iVar3;
  long lVar4;
  uint uVar5;
  pointer puVar6;
  size_type __n;
  uchar item;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vlv;
  value_type_conflict1 local_4d;
  int local_4c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  puVar6 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = (int)puVar1 - (int)puVar6;
  iVar3 = iVar2 + -1;
  uVar5 = 0;
  lVar4 = (long)puVar1 - (long)puVar6;
  if (lVar4 != 0) {
    uVar5 = (uint)(*puVar6 == 0xf0);
    if (puVar1[-1] == 0xf7) {
      iVar3 = iVar2 + -2;
    }
  }
  puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
    lVar4 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar6;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,lVar4 + 7);
  local_48._M_impl.super__Vector_impl_data._M_start._0_1_ = 0xf0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,(uchar *)&local_48);
  local_4c = iVar3;
  intToVlv((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(iVar3 - uVar5) + 2);
  for (puVar6 = (pointer)CONCAT71(local_48._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  local_48._M_impl.super__Vector_impl_data._M_start._0_1_);
      puVar6 != local_48._M_impl.super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    local_4d = *puVar6;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_4d);
  }
  lVar4 = (long)local_4c;
  for (__n = (size_type)uVar5; (long)__n <= lVar4; __n = __n + 1) {
    __x = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,__n);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__x);
  }
  local_4d = 0xf7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_4d);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void MidiMessage::makeSysExMessage(const std::vector<uchar>& data) {
	int startindex = 0;
	int endindex = (int)data.size() - 1;
	if (data.size() > 0) {
		if (data[0] == 0xf0) {
			startindex++;
		}
	}
	if (data.size() > 0) {
		if (data.back() == 0xf7) {
			endindex--;
		}
	}

	this->clear();
	this->reserve(data.size() + 7);

	this->push_back((uchar)0xf0);

	int msize = endindex - startindex + 2;
	std::vector<uchar> vlv = intToVlv(msize);
	for (uchar item : vlv) {
		this->push_back(item);
	}
	for (int i=startindex; i<=endindex; i++) {
		this->push_back(data.at(i));
	}
	this->push_back((uchar)0xf7);
}